

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O3

void __thiscall
boost::asio::detail::
timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::down_heap(timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *this,size_t index)

{
  pointer phVar1;
  duration dVar2;
  per_timer_data *ppVar3;
  per_timer_data *ppVar4;
  pointer phVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar10;
  long lVar9;
  
  uVar6 = index * 2 + 1;
  phVar5 = (this->heap_).
           super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->heap_).
                 super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)phVar5 >> 4;
  if (uVar6 < uVar10) {
    lVar9 = index * 2;
    do {
      uVar8 = lVar9 + 2;
      uVar7 = uVar6;
      if ((uVar8 != uVar10) && (phVar5[uVar8].time_.__d.__r <= phVar5[uVar6].time_.__d.__r)) {
        uVar7 = uVar8;
      }
      if (phVar5[index].time_.__d.__r < phVar5[uVar7].time_.__d.__r) {
        return;
      }
      phVar1 = phVar5 + index;
      dVar2.__r = (phVar1->time_).__d.__r;
      ppVar3 = phVar1->timer_;
      ppVar4 = phVar5[uVar7].timer_;
      (phVar1->time_).__d.__r = phVar5[uVar7].time_.__d.__r;
      phVar1->timer_ = ppVar4;
      phVar5 = (this->heap_).
               super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7;
      (phVar5->time_).__d.__r = dVar2.__r;
      phVar5->timer_ = ppVar3;
      phVar5 = (this->heap_).
               super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (phVar5[index].timer_)->heap_index_ = index;
      (phVar5[uVar7].timer_)->heap_index_ = uVar7;
      lVar9 = uVar7 * 2;
      uVar6 = uVar7 * 2 + 1;
      uVar10 = (long)(this->heap_).
                     super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)phVar5 >> 4;
      index = uVar7;
    } while (uVar6 < uVar10);
  }
  return;
}

Assistant:

void down_heap(std::size_t index)
  {
    std::size_t child = index * 2 + 1;
    while (child < heap_.size())
    {
      std::size_t min_child = (child + 1 == heap_.size()
          || Time_Traits::less_than(
            heap_[child].time_, heap_[child + 1].time_))
        ? child : child + 1;
      if (Time_Traits::less_than(heap_[index].time_, heap_[min_child].time_))
        break;
      swap_heap(index, min_child);
      index = min_child;
      child = index * 2 + 1;
    }
  }